

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

uint8 * __thiscall
caffe::NetParameter::InternalSerializeWithCachedSizesToArray
          (NetParameter *this,bool deterministic,uint8 *target)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  int iVar1;
  string *psVar2;
  char *data;
  Rep *pRVar3;
  NetState *this_01;
  void *pvVar4;
  bool bVar5;
  NetParameter *pNVar6;
  uint uVar7;
  Type *this_02;
  Type *pTVar8;
  LogMessage *other;
  Type *this_03;
  Type *this_04;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  byte *pbVar17;
  LogFinisher local_79;
  uint local_78;
  uint local_74;
  NetParameter *local_70;
  LogMessage local_68;
  
  local_78 = (this->_has_bits_).has_bits_[0];
  if ((local_78 & 1) != 0) {
    psVar2 = (this->name_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "caffe.NetParameter.name");
    psVar2 = (this->name_).ptr_;
    *target = '\n';
    target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray(psVar2,target + 1);
  }
  iVar1 = (this->layers_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar16 = 0;
    do {
      this_02 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                          (&(this->layers_).super_RepeatedPtrFieldBase,iVar16);
      *target = 0x12;
      pbVar17 = target + 1;
      uVar12 = this_02->_cached_size_;
      uVar9 = uVar12;
      if (0x7f < uVar12) {
        do {
          *pbVar17 = (byte)uVar12 | 0x80;
          uVar9 = uVar12 >> 7;
          pbVar17 = pbVar17 + 1;
          bVar5 = 0x3fff < uVar12;
          uVar12 = uVar9;
        } while (bVar5);
      }
      *pbVar17 = (byte)uVar9;
      target = V1LayerParameter::InternalSerializeWithCachedSizesToArray
                         (this_02,deterministic,pbVar17 + 1);
      iVar16 = iVar16 + 1;
    } while (iVar16 != iVar1);
  }
  iVar1 = (this->input_).super_RepeatedPtrFieldBase.current_size_;
  local_74 = (uint)deterministic;
  local_70 = this;
  if (0 < iVar1) {
    this_00 = &this->input_;
    iVar16 = 0;
    do {
      pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,iVar16);
      data = (pTVar8->_M_dataplus)._M_p;
      pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,iVar16);
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                (data,(int)pTVar8->_M_string_length,SERIALIZE,"caffe.NetParameter.input");
      pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,iVar16);
      *target = 0x1a;
      target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
                         (pTVar8,target + 1);
      iVar16 = iVar16 + 1;
    } while (iVar1 != iVar16);
  }
  pNVar6 = local_70;
  uVar9 = local_74;
  uVar12 = (local_70->input_dim_).current_size_;
  if (uVar12 != 0) {
    if ((local_70->input_dim_).rep_ == (Rep *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      other = google::protobuf::internal::LogMessage::operator<<(&local_68,"CHECK failed: rep_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_79,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    pRVar3 = (pNVar6->input_dim_).rep_;
    uVar11 = 1;
    if (1 < (int)uVar12) {
      uVar11 = (ulong)uVar12;
    }
    uVar13 = 0;
    do {
      uVar14 = (ulong)pRVar3->elements[uVar13];
      pbVar17 = target + 1;
      *target = 0x20;
      uVar15 = uVar14;
      if (0x7f < uVar14) {
        do {
          *pbVar17 = (byte)uVar14 | 0x80;
          uVar15 = uVar14 >> 7;
          pbVar17 = pbVar17 + 1;
          bVar5 = 0x3fff < uVar14;
          uVar14 = uVar15;
        } while (bVar5);
      }
      *pbVar17 = (byte)uVar15;
      target = pbVar17 + 1;
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar11);
  }
  uVar12 = local_78;
  if ((local_78 & 4) != 0) {
    bVar5 = pNVar6->force_backward_;
    *target = 0x28;
    target[1] = bVar5;
    target = target + 2;
  }
  if ((local_78 & 2) != 0) {
    this_01 = pNVar6->state_;
    *target = 0x32;
    pbVar17 = target + 1;
    uVar10 = this_01->_cached_size_;
    uVar7 = uVar10;
    if (0x7f < uVar10) {
      do {
        *pbVar17 = (byte)uVar10 | 0x80;
        uVar7 = uVar10 >> 7;
        pbVar17 = pbVar17 + 1;
        bVar5 = 0x3fff < uVar10;
        uVar10 = uVar7;
      } while (bVar5);
    }
    *pbVar17 = (byte)uVar7;
    target = NetState::InternalSerializeWithCachedSizesToArray(this_01,false,pbVar17 + 1);
  }
  if ((uVar12 & 8) != 0) {
    bVar5 = pNVar6->debug_info_;
    *target = 0x38;
    target[1] = bVar5;
    target = target + 2;
  }
  iVar1 = (pNVar6->input_shape_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar16 = 0;
    do {
      this_03 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobShape>::TypeHandler>
                          (&(pNVar6->input_shape_).super_RepeatedPtrFieldBase,iVar16);
      *target = 0x42;
      pbVar17 = target + 1;
      uVar12 = this_03->_cached_size_;
      uVar10 = uVar12;
      if (0x7f < uVar12) {
        do {
          *pbVar17 = (byte)uVar12 | 0x80;
          uVar10 = uVar12 >> 7;
          pbVar17 = pbVar17 + 1;
          bVar5 = 0x3fff < uVar12;
          uVar12 = uVar10;
        } while (bVar5);
      }
      *pbVar17 = (byte)uVar10;
      target = BlobShape::InternalSerializeWithCachedSizesToArray(this_03,false,pbVar17 + 1);
      iVar16 = iVar16 + 1;
    } while (iVar16 != iVar1);
  }
  iVar1 = (pNVar6->layer_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar16 = 0;
    do {
      this_04 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                          (&(pNVar6->layer_).super_RepeatedPtrFieldBase,iVar16);
      target[0] = 0xa2;
      target[1] = 6;
      pbVar17 = target + 2;
      uVar12 = this_04->_cached_size_;
      uVar10 = uVar12;
      if (0x7f < uVar12) {
        do {
          *pbVar17 = (byte)uVar12 | 0x80;
          uVar10 = uVar12 >> 7;
          pbVar17 = pbVar17 + 1;
          bVar5 = 0x3fff < uVar12;
          uVar12 = uVar10;
        } while (bVar5);
      }
      *pbVar17 = (byte)uVar10;
      target = LayerParameter::InternalSerializeWithCachedSizesToArray
                         (this_04,SUB41(uVar9,0),pbVar17 + 1);
      iVar16 = iVar16 + 1;
    } while (iVar16 != iVar1);
  }
  pvVar4 = (pNVar6->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar4 & 1) != 0) {
    target = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe),target);
  }
  return target;
}

Assistant:

::google::protobuf::uint8* NetParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.NetParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.NetParameter.name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // repeated .caffe.V1LayerParameter layers = 2;
  for (unsigned int i = 0, n = this->layers_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        2, this->layers(i), deterministic, target);
  }

  // repeated string input = 3;
  for (int i = 0, n = this->input_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->input(i).data(), this->input(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.NetParameter.input");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(3, this->input(i), target);
  }

  // repeated int32 input_dim = 4;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteInt32ToArray(4, this->input_dim_, target);

  // optional bool force_backward = 5 [default = false];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(5, this->force_backward(), target);
  }

  // optional .caffe.NetState state = 6;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        6, *this->state_, deterministic, target);
  }

  // optional bool debug_info = 7 [default = false];
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(7, this->debug_info(), target);
  }

  // repeated .caffe.BlobShape input_shape = 8;
  for (unsigned int i = 0, n = this->input_shape_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        8, this->input_shape(i), deterministic, target);
  }

  // repeated .caffe.LayerParameter layer = 100;
  for (unsigned int i = 0, n = this->layer_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        100, this->layer(i), deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.NetParameter)
  return target;
}